

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.h
# Opt level: O1

bool __thiscall libmatroska::DataBuffer::FreeBuffer(DataBuffer *this,DataBuffer *aBuffer)

{
  bool bVar1;
  
  bVar1 = true;
  if ((this->myBuffer != (binary *)0x0) && (this->bValidValue == true)) {
    bVar1 = true;
    if (this->myFreeBuffer != (_func_bool_DataBuffer_ptr *)0x0) {
      bVar1 = (*this->myFreeBuffer)(aBuffer);
    }
    if ((this->bInternalBuffer == true) && (this->myBuffer != (binary *)0x0)) {
      operator_delete__(this->myBuffer);
    }
    this->myBuffer = (binary *)0x0;
    this->mySize = 0;
    this->bValidValue = false;
  }
  return bVar1;
}

Assistant:

bool    FreeBuffer(const DataBuffer & aBuffer) {
      bool bResult = true;
      if (myBuffer != NULL && bValidValue) {
        if (myFreeBuffer != NULL)
          bResult = myFreeBuffer(aBuffer);
        if (bInternalBuffer)
          delete [] myBuffer;
        myBuffer = NULL;
        mySize = 0;
        bValidValue = false;
      }
      return bResult;
    }